

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile.c
# Opt level: O3

PList * p_ini_file_keys(PIniFile *file,pchar *section)

{
  int iVar1;
  pchar *ppVar2;
  PList *list;
  undefined8 *puVar3;
  
  if (file != (PIniFile *)0x0) {
    if (section == (pchar *)0x0) {
      return (PList *)0x0;
    }
    if (file->is_parsed == 0) {
      return (PList *)0x0;
    }
    do {
      file = (PIniFile *)file->sections;
      if (file == (PIniFile *)0x0) {
        return (PList *)0x0;
      }
      ppVar2 = file->path;
      iVar1 = strcmp(*(char **)ppVar2,section);
    } while (iVar1 != 0);
    puVar3 = *(undefined8 **)(ppVar2 + 8);
    if (puVar3 != (undefined8 *)0x0) {
      list = (PList *)0x0;
      do {
        ppVar2 = p_strdup(*(pchar **)*puVar3);
        list = p_list_prepend(list,ppVar2);
        puVar3 = (undefined8 *)puVar3[1];
      } while (puVar3 != (undefined8 *)0x0);
      return list;
    }
  }
  return (PList *)0x0;
}

Assistant:

P_LIB_API PList *
p_ini_file_keys (const PIniFile	*file,
		 const pchar	*section)
{
	PList	*ret;
	PList	*item;

	if (P_UNLIKELY (file == NULL || file->is_parsed == FALSE || section == NULL))
		return NULL;

	ret = NULL;

	for (item = file->sections; item != NULL; item = item->next)
		if (strcmp (((PIniSection *) item->data)->name, section) == 0)
			break;

	if (item == NULL)
		return NULL;

	for (item = ((PIniSection *) item->data)->keys; item != NULL; item = item->next)
		ret = p_list_prepend (ret, p_strdup (((PIniParameter *) item->data)->name));

	return ret;
}